

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<GraphMaker*,LongReadsDatastore_const&,int,int,int>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul>(void *param_1,long param_2)

{
  reference pvVar1;
  initializer_list<bool> *this;
  vector<bool,_std::allocator<bool>_> *this_00;
  const_iterator pbVar2;
  reference rVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  undefined8 in_stack_ffffffffffffff10;
  undefined1 uVar4;
  type_caster_generic *in_stack_ffffffffffffff18;
  handle in_stack_ffffffffffffff20;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff30;
  const_iterator local_b8;
  _Bit_reference in_stack_ffffffffffffff50;
  undefined1 convert;
  type_caster<int,_void> *in_stack_ffffffffffffff60;
  PyObject *this_01;
  handle in_stack_ffffffffffffff68;
  handle src;
  reference local_80;
  PyObject *local_70;
  reference local_68;
  PyObject *local_58;
  reference local_50;
  PyObject *local_40;
  bool local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  convert = in_stack_ffffffffffffff50._M_mask._7_1_;
  uVar4 = (undefined1)((ulong)in_stack_ffffffffffffff10 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<GraphMaker,void>,pybind11::detail::type_caster<LongReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
            ((tuple<pybind11::detail::type_caster<GraphMaker,_void>,_pybind11::detail::type_caster<LongReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
              *)0x451529);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff30,(size_type)param_1);
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_35 = type_caster_generic::load
                       (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,(bool)uVar4);
  this = (initializer_list<bool> *)
         std::
         get<1ul,pybind11::detail::type_caster<GraphMaker,void>,pybind11::detail::type_caster<LongReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
                   ((tuple<pybind11::detail::type_caster<GraphMaker,_void>,_pybind11::detail::type_caster<LongReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
                     *)0x4515a9);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  local_58 = pvVar1->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff30,(size_type)param_1);
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  local_34 = type_caster_generic::load
                       (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,
                        SUB81((ulong)this >> 0x38,0));
  std::
  get<2ul,pybind11::detail::type_caster<GraphMaker,void>,pybind11::detail::type_caster<LongReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
            ((tuple<pybind11::detail::type_caster<GraphMaker,_void>,_pybind11::detail::type_caster<LongReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
              *)0x45162d);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      2);
  local_70 = pvVar1->m_ptr;
  local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff30,(size_type)param_1);
  std::_Bit_reference::operator_cast_to_bool(&local_80);
  local_33 = type_caster<int,_void>::load
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,(bool)convert);
  std::
  get<3ul,pybind11::detail::type_caster<GraphMaker,void>,pybind11::detail::type_caster<LongReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
            ((tuple<pybind11::detail::type_caster<GraphMaker,_void>,_pybind11::detail::type_caster<LongReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
              *)0x4516ab);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),3);
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    (in_stack_ffffffffffffff30,(size_type)param_1);
  src.m_ptr = (PyObject *)rVar3._M_p;
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff68);
  local_32 = type_caster<int,_void>::load(in_stack_ffffffffffffff60,src,(bool)convert);
  this_00 = (vector<bool,_std::allocator<bool>_> *)
            std::
            get<4ul,pybind11::detail::type_caster<GraphMaker,void>,pybind11::detail::type_caster<LongReadsDatastore,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
                      ((tuple<pybind11::detail::type_caster<GraphMaker,_void>,_pybind11::detail::type_caster<LongReadsDatastore,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
                        *)0x451720);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      4);
  this_01 = pvVar1->m_ptr;
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)param_1);
  uVar4 = rVar3._M_mask._7_1_;
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff50);
  local_31 = type_caster<int,_void>::load((type_caster<int,_void> *)this_01,src,(bool)uVar4);
  local_30._M_array = &local_35;
  local_30._M_len = 5;
  local_20 = &local_30;
  local_b8 = std::initializer_list<bool>::begin(local_20);
  pbVar2 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (local_b8 == pbVar2) {
      return true;
    }
    if ((*local_b8 & 1U) == 0) break;
    local_b8 = local_b8 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }